

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::ClosedPathsFromPolyTree(PolyTree *polytree,Paths *paths)

{
  pointer ppPVar1;
  int iVar2;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(paths,0);
  ppPVar1 = (polytree->AllNodes).
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar2 = (int)((ulong)((long)(polytree->AllNodes).
                              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1) >> 3);
  if (0 < iVar2) {
    iVar2 = iVar2 - (uint)(*(polytree->super_PolyNode).Childs.
                            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start != *ppPVar1);
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(paths,(long)iVar2);
  AddPolyNodeToPaths(&polytree->super_PolyNode,ntClosed,paths);
  return;
}

Assistant:

void ClosedPathsFromPolyTree(const PolyTree& polytree, Paths& paths)
{
  paths.resize(0); 
  paths.reserve(polytree.Total());
  AddPolyNodeToPaths(polytree, ntClosed, paths);
}